

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<unsigned_char,unsigned_short>(void)

{
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int iVar2;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_ffffffffffffffbd;
  unsigned_short in_stack_ffffffffffffffbe;
  unsigned_short u;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  int local_38;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_33;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  
  u = 0;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_short>(&local_33,&u);
  su.m_int = u;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_short>(&st2,&su);
  local_33.m_int = '\0';
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &local_33,&u);
  if (su.m_int < 0x100) {
    local_33.m_int = st2.m_int;
    SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
              ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_33,u);
    if ((char)((ushort)((ushort)local_33.m_int * (ushort)st2.m_int) >> 8) == '\0') {
      operator*(u,local_33);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,su);
      u = 1;
      iVar2 = 1;
      local_38 = iVar2;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,&local_38);
      local_38 = iVar2;
      SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su
                 ,&local_38);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      local_38 = iVar2;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2
                 ,&local_38);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                (&local_33,st2);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,su);
      u = 1;
      local_38 = iVar2;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2
                 ,&local_38);
      local_38 = iVar2;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,&local_38);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
                (&local_33,st2);
      operator/(u,local_33);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,su);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                (&local_33,st2);
      operator+(u,local_33);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,su);
      local_38 = 0;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,&local_38);
      u = 0;
      local_38 = 0;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2
                 ,&local_38);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
                (&local_33,st2);
      operator-(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbd);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      local_38 = iVar2;
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,&local_38);
      local_38 = iVar2;
      SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su
                 ,&local_38);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,su);
      u = 1;
      local_38 = iVar2;
      SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su
                 ,&local_38);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      SVar1 = SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::
              operator<<((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)&local_33,su);
      operator<<(SVar1.m_int,su);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,su);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      SVar1 = SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::
              operator>>((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)&local_33,su);
      operator>>(SVar1.m_int,su);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,u);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
                ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_33,su);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
                (&local_33,st2);
      local_38._0_2_ = (local_33.m_int & (byte)u) & su.m_int;
      SafeInt::operator_cast_to_unsigned_char((SafeInt *)&local_38);
      local_38._0_2_ = u & 0xff | su.m_int;
      local_33.m_int = (byte)su.m_int & (byte)u & local_33.m_int & st2.m_int;
      SafeInt::operator_cast_to_unsigned_char((SafeInt *)&local_38);
      local_33.m_int = (byte)su.m_int | (byte)u | local_33.m_int | st2.m_int;
      local_38 = CONCAT22(local_38._2_2_,(local_33.m_int ^ (byte)u) ^ su.m_int);
      SafeInt::operator_cast_to_unsigned_char((SafeInt *)&local_38);
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}